

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_COMMAND_AUDIT_INFO_Unmarshal(TPMS_COMMAND_AUDIT_INFO *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  UINT64 UVar4;
  
  iVar1 = *size;
  *size = iVar1 + -8;
  TVar3 = 0x9a;
  if (7 < iVar1) {
    UVar4 = ByteArrayToUint64(*buffer);
    target->auditCounter = UVar4;
    *buffer = *buffer + 8;
    iVar1 = *size;
    *size = iVar1 + -2;
    TVar3 = 0x9a;
    if (1 < iVar1) {
      UVar2 = ByteArrayToUint16(*buffer);
      target->digestAlg = UVar2;
      *buffer = *buffer + 2;
      TVar3 = TPM2B_DIGEST_Unmarshal(&target->auditDigest,buffer,size);
      if (TVar3 == 0) {
        TVar3 = TPM2B_DIGEST_Unmarshal(&target->commandDigest,buffer,size);
        return TVar3;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMS_COMMAND_AUDIT_INFO_Unmarshal(TPMS_COMMAND_AUDIT_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->auditCounter), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)&(target->digestAlg), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->auditDigest), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->commandDigest), buffer, size);
    return result;
}